

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::TestFactoryImpl<YeeGridTest1d_GetCellIndex_Test>::CreateTest
          (TestFactoryImpl<YeeGridTest1d_GetCellIndex_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x30);
  Test::Test(this_00);
  *(undefined8 *)((long)&this_00[1].gtest_flag_saver_ + 4) = 0;
  *(undefined8 *)((long)&this_00[2]._vptr_Test + 4) = 0;
  this_00[1]._vptr_Test = (_func_int **)0x0;
  this_00[1].gtest_flag_saver_ = (GTestFlagSaver *)0x0;
  this_00->_vptr_Test = (_func_int **)&PTR__YeeGridTest1d_001f4350;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }